

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Node::DumpAscii(Node *this,ostream *s,int indent)

{
  bool bVar1;
  byte local_29;
  int indent_local;
  ostream *s_local;
  Node *this_local;
  
  BeginAscii(this,s,indent);
  DumpPropertiesAscii(this,s,indent);
  if ((this->force_has_children & 1U) == 0) {
    bVar1 = std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::empty
                      (&this->children);
    if (bVar1) goto LAB_00b3a8f8;
  }
  BeginChildrenAscii(this,s,indent + 1);
  DumpChildrenAscii(this,s,indent + 1);
LAB_00b3a8f8:
  local_29 = 1;
  if ((this->force_has_children & 1U) == 0) {
    bVar1 = std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::empty
                      (&this->children);
    local_29 = bVar1 ^ 0xff;
  }
  EndAscii(this,s,indent,(bool)(local_29 & 1));
  return;
}

Assistant:

void FBX::Node::DumpAscii(std::ostream &s, int indent)
{
    // write name
    BeginAscii(s, indent);

    // write properties
    DumpPropertiesAscii(s, indent);

    if (force_has_children || !children.empty()) {
        // begin children (with a '{')
        BeginChildrenAscii(s, indent + 1);
        // write children
        DumpChildrenAscii(s, indent + 1);
    }

    // finish (also closing the children bracket '}')
    EndAscii(s, indent, force_has_children || !children.empty());
}